

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O1

void __thiscall
lunasvg::SVGLayoutState::SVGLayoutState
          (SVGLayoutState *this,SVGLayoutState *parent,SVGElement *element)

{
  pointer pcVar1;
  _Fwd_list_node_base *p_Var2;
  string_view input_00;
  string_view input_01;
  string_view input_02;
  string_view input_03;
  string_view input_04;
  char *__s1;
  AlignmentBaseline AVar3;
  Overflow OVar4;
  Visibility VVar5;
  LineJoin LVar6;
  MaskType MVar7;
  Display DVar8;
  DominantBaseline DVar9;
  FontWeight FVar10;
  Direction DVar11;
  WhiteSpace WVar12;
  FillRule FVar13;
  FontStyle FVar14;
  LineCap LVar15;
  TextAnchor TVar16;
  int iVar17;
  uint uVar18;
  Color CVar19;
  Length LVar20;
  Type TVar21;
  LengthUnits LVar22;
  Length LVar23;
  Length __n;
  Length __n_00;
  Length __n_01;
  Length __n_02;
  Length LVar24;
  Length LVar25;
  ulong uVar26;
  string *this_00;
  Length in_R8;
  Color *in_R9;
  long lVar27;
  bool bVar28;
  float fVar29;
  string_view input_05;
  string_view input_06;
  string_view input_07;
  string_view input_08;
  string_view input_09;
  string_view input_10;
  string_view input_11;
  string_view input_12;
  string_view input_13;
  string_view input_14;
  string_view input_15;
  string_view input_16;
  string_view input_17;
  string_view input;
  LengthList values;
  char *in_stack_fffffffffffffec8;
  string_view local_128;
  Paint local_118;
  string_view local_e8;
  Length local_d8;
  lunasvg *plStack_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  string *local_80;
  string *local_78;
  string *local_70;
  string *local_68;
  LengthList *local_60;
  string *local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  Length local_38;
  
  this->m_parent = parent;
  this->m_element = element;
  local_40 = (string *)&this->m_fill;
  local_88 = &(this->m_fill).m_id.field_2;
  (this->m_fill).m_id._M_dataplus._M_p = (pointer)local_88;
  pcVar1 = (parent->m_fill).m_id._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            (local_40,pcVar1,pcVar1 + (parent->m_fill).m_id._M_string_length);
  (this->m_fill).m_color.m_value = (parent->m_fill).m_color.m_value;
  local_48 = (string *)&this->m_stroke;
  local_90 = &(this->m_stroke).m_id.field_2;
  (this->m_stroke).m_id._M_dataplus._M_p = (pointer)local_90;
  pcVar1 = (parent->m_stroke).m_id._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            (local_48,pcVar1,pcVar1 + (parent->m_stroke).m_id._M_string_length);
  (this->m_stroke).m_color.m_value = (parent->m_stroke).m_color.m_value;
  (this->m_color).m_value = (parent->m_color).m_value;
  (this->m_stop_color).m_value = 0xff000000;
  this->m_opacity = 1.0;
  this->m_fill_opacity = parent->m_fill_opacity;
  this->m_stroke_opacity = parent->m_stroke_opacity;
  this->m_stop_opacity = 1.0;
  this->m_stroke_miterlimit = parent->m_stroke_miterlimit;
  this->m_font_size = parent->m_font_size;
  (this->m_baseline_shit).m_type = Baseline;
  (this->m_baseline_shit).m_length.m_value = 0.0;
  (this->m_baseline_shit).m_length.m_units = None;
  this->m_stroke_width = parent->m_stroke_width;
  this->m_stroke_dashoffset = parent->m_stroke_dashoffset;
  local_60 = &this->m_stroke_dasharray;
  std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>::vector
            (local_60,&parent->m_stroke_dasharray);
  this->m_stroke_linecap = parent->m_stroke_linecap;
  this->m_stroke_linejoin = parent->m_stroke_linejoin;
  this->m_fill_rule = parent->m_fill_rule;
  this->m_clip_rule = parent->m_clip_rule;
  this->m_font_weight = parent->m_font_weight;
  this->m_font_style = parent->m_font_style;
  this->m_alignment_baseline = Auto;
  this->m_dominant_baseline = parent->m_dominant_baseline;
  this->m_text_anchor = parent->m_text_anchor;
  this->m_white_space = parent->m_white_space;
  this->m_direction = parent->m_direction;
  this->m_display = Inline;
  this->m_visibility = parent->m_visibility;
  this->m_overflow = (element->super_SVGNode).m_parentElement != (SVGElement *)0x0;
  this->m_mask_type = Luminance;
  local_50 = (string *)&this->m_mask;
  local_98 = &(this->m_mask).field_2;
  (this->m_mask)._M_dataplus._M_p = (pointer)local_98;
  (this->m_mask)._M_string_length = 0;
  (this->m_mask).field_2._M_local_buf[0] = '\0';
  local_58 = (string *)&this->m_clip_path;
  local_a0 = &(this->m_clip_path).field_2;
  (this->m_clip_path)._M_dataplus._M_p = (pointer)local_a0;
  (this->m_clip_path)._M_string_length = 0;
  (this->m_clip_path).field_2._M_local_buf[0] = '\0';
  local_68 = (string *)&this->m_marker_start;
  local_a8 = &(this->m_marker_start).field_2;
  (this->m_marker_start)._M_dataplus._M_p = (pointer)local_a8;
  pcVar1 = (parent->m_marker_start)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            (local_68,pcVar1,pcVar1 + (parent->m_marker_start)._M_string_length);
  local_70 = (string *)&this->m_marker_mid;
  local_b0 = &(this->m_marker_mid).field_2;
  (this->m_marker_mid)._M_dataplus._M_p = (pointer)local_b0;
  pcVar1 = (parent->m_marker_mid)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            (local_70,pcVar1,pcVar1 + (parent->m_marker_mid)._M_string_length);
  local_78 = (string *)&this->m_marker_end;
  local_b8 = &(this->m_marker_end).field_2;
  (this->m_marker_end)._M_dataplus._M_p = (pointer)local_b8;
  pcVar1 = (parent->m_marker_end)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            (local_78,pcVar1,pcVar1 + (parent->m_marker_end)._M_string_length);
  local_80 = &this->m_font_family;
  local_c0 = &(this->m_font_family).field_2;
  (this->m_font_family)._M_dataplus._M_p = (pointer)local_c0;
  pcVar1 = (parent->m_font_family)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar1,pcVar1 + (parent->m_font_family)._M_string_length);
  p_Var2 = (element->m_attributes).
           super__Fwd_list_base<lunasvg::Attribute,_std::allocator<lunasvg::Attribute>_>._M_impl.
           _M_head._M_next;
  do {
    if (p_Var2 == (_Fwd_list_node_base *)0x0) {
      return;
    }
    local_128._M_str = (char *)p_Var2[2]._M_next;
    local_128._M_len = *(size_t *)(p_Var2 + 3);
    stripLeadingAndTrailingSpaces(&local_128);
    LVar25 = (Length)local_128._M_len;
    if ((Length)local_128._M_len == (Length)0x0) goto switchD_00115b4a_caseD_3;
    bVar28 = (Length)local_128._M_len == (Length)0x7;
    LVar23.m_value = 9.80909e-45;
    LVar23.m_units = None;
    LVar23._5_3_ = 0;
    if (local_128._M_len < 7) {
      LVar23 = (Length)local_128._M_len;
    }
    iVar17 = bcmp(local_128._M_str,"inherit",(size_t)LVar23);
    __s1 = local_128._M_str;
    if (iVar17 == 0 && bVar28) goto switchD_00115b4a_caseD_3;
    switch(*(undefined1 *)((long)&p_Var2[1]._M_next + 4)) {
    case 1:
      lVar27 = 0x10;
      do {
        bVar28 = LVar25 == *(Length *)(&UNK_00159b98 + lVar27);
        if (bVar28) {
          iVar17 = bcmp(__s1,*(void **)(&parseAlignmentBaseline(std::basic_string_view<char,std::char_traits<char>>const&)
                                         ::entries + lVar27),(size_t)LVar25);
          bVar28 = iVar17 == 0;
        }
        if (bVar28) {
          AVar3 = (&UNK_00159b90)[lVar27];
          goto LAB_001164bf;
        }
        lVar27 = lVar27 + 0x18;
      } while (lVar27 != 0x130);
      AVar3 = Auto;
LAB_001164bf:
      this->m_alignment_baseline = AVar3;
      break;
    case 2:
      __n_00.m_value = 1.12104e-44;
      __n_00.m_units = None;
      __n_00._5_3_ = 0;
      if ((ulong)LVar25 < 8) {
        __n_00 = LVar25;
      }
      iVar17 = bcmp(local_128._M_str,"baseline",(size_t)__n_00);
      LVar20.m_value = 0.0;
      LVar20.m_units = None;
      LVar20._5_3_ = 0;
      LVar22 = None;
      TVar21 = Baseline;
      if (iVar17 != 0 || LVar25 != (Length)0x8) {
        __n_01.m_value = 4.2039e-45;
        __n_01.m_units = None;
        __n_01._5_3_ = 0;
        if ((ulong)LVar25 < 3) {
          __n_01 = LVar25;
        }
        iVar17 = bcmp(local_128._M_str,"sub",(size_t)__n_01);
        if (iVar17 == 0 && LVar25 == (Length)0x3) {
          TVar21 = Sub;
        }
        else {
          __n_02.m_value = 7.00649e-45;
          __n_02.m_units = None;
          __n_02._5_3_ = 0;
          if ((ulong)LVar25 < 5) {
            __n_02 = LVar25;
          }
          iVar17 = bcmp(local_128._M_str,"super",(size_t)__n_02);
          if (iVar17 != 0 || LVar25 != (Length)0x5) {
            local_118.m_id._M_dataplus._M_p = local_118.m_id._M_dataplus._M_p & 0xffffff0000000000;
            input_15._M_str = local_128._M_str;
            input_15._M_len = (size_t)LVar25;
            bVar28 = Length::parse((Length *)&local_118,input_15,Allow);
            if (!bVar28) {
              local_118.m_id._M_dataplus._M_p = local_118.m_id._M_dataplus._M_p & 0xffffff0000000000
              ;
            }
            LVar22 = (LengthUnits)((ulong)local_118.m_id._M_dataplus._M_p >> 0x20);
            TVar21 = Length;
            LVar20 = (Length)local_118.m_id._M_dataplus._M_p;
            goto LAB_0011670c;
          }
          TVar21 = Super;
        }
        LVar20.m_value = 0.0;
        LVar20.m_units = None;
        LVar20._5_3_ = 0;
        LVar22 = None;
      }
LAB_0011670c:
      (this->m_baseline_shit).m_type = TVar21;
      (this->m_baseline_shit).m_length.m_value = LVar20.m_value;
      (this->m_baseline_shit).m_length.m_units = LVar22;
      break;
    case 5:
      input_01._M_str = in_stack_fffffffffffffec8;
      input_01._M_len = 0x1160dc;
      parseUrl_abi_cxx11_(input_01);
      this_00 = local_58;
      goto LAB_001162bb;
    case 6:
      FVar13 = parseFillRule(&local_128);
      this->m_clip_rule = FVar13;
      break;
    case 7:
      input_09._M_str = (char *)this;
      input_09._M_len = (size_t)local_128._M_str;
      CVar19 = parseColor((lunasvg *)LVar25,input_09,(SVGLayoutState *)&Color::Black,(Color *)in_R8)
      ;
      (this->m_color).m_value = CVar19.m_value;
      break;
    case 0xb:
      lVar27 = 0x10;
      do {
        bVar28 = LVar25 == *(Length *)(&UNK_00159dd8 + lVar27);
        if (bVar28) {
          iVar17 = bcmp(__s1,*(void **)(&parseDirection(std::basic_string_view<char,std::char_traits<char>>const&)
                                         ::entries + lVar27),(size_t)LVar25);
          bVar28 = iVar17 == 0;
        }
        if (bVar28) {
          DVar11 = (&UNK_00159dd0)[lVar27];
          goto LAB_001164d9;
        }
        lVar27 = lVar27 + 0x18;
      } while (lVar27 != 0x40);
      DVar11 = Ltr;
LAB_001164d9:
      this->m_direction = DVar11;
      break;
    case 0xc:
      lVar27 = 0x10;
      do {
        bVar28 = LVar25 == *(Length *)(&UNK_00159f08 + lVar27);
        if (bVar28) {
          iVar17 = bcmp(__s1,*(void **)(&parseDisplay(std::basic_string_view<char,std::char_traits<char>>const&)
                                         ::entries + lVar27),(size_t)LVar25);
          bVar28 = iVar17 == 0;
        }
        if (bVar28) {
          DVar8 = (&UNK_00159f00)[lVar27];
          goto LAB_001164a5;
        }
        lVar27 = lVar27 + 0x18;
      } while (lVar27 != 0x40);
      DVar8 = Inline;
LAB_001164a5:
      this->m_display = DVar8;
      break;
    case 0xd:
      lVar27 = 0x10;
      do {
        bVar28 = LVar25 == *(Length *)(&UNK_00159cb8 + lVar27);
        if (bVar28) {
          iVar17 = bcmp(__s1,*(void **)(&parseDominantBaseline(std::basic_string_view<char,std::char_traits<char>>const&)
                                         ::entries + lVar27),(size_t)LVar25);
          bVar28 = iVar17 == 0;
        }
        if (bVar28) {
          DVar9 = (&UNK_00159cb0)[lVar27];
          goto LAB_001164b2;
        }
        lVar27 = lVar27 + 0x18;
      } while (lVar27 != 0x130);
      DVar9 = Auto;
LAB_001164b2:
      this->m_dominant_baseline = DVar9;
      break;
    case 0x10:
      in_R8 = (Length)&Color::Black;
      input_17._M_str = (char *)this;
      input_17._M_len = (size_t)local_128._M_str;
      parsePaint(&local_118,(lunasvg *)LVar25,input_17,(SVGLayoutState *)&Color::Black,in_R9);
      std::__cxx11::string::operator=(local_40,(string *)&local_118);
      (this->m_fill).m_color.m_value = local_118.m_color.m_value;
      goto LAB_001162c3;
    case 0x11:
      input_10._M_str = (char *)0x1;
      input_10._M_len = (size_t)local_128._M_str;
      fVar29 = parseNumberOrPercentage((lunasvg *)LVar25,input_10,true,1.0);
      this->m_fill_opacity = fVar29;
      break;
    case 0x12:
      FVar13 = parseFillRule(&local_128);
      this->m_fill_rule = FVar13;
      break;
    case 0x13:
      std::__cxx11::string::_M_replace
                ((ulong)local_80,0,(char *)(this->m_font_family)._M_string_length,
                 (ulong)local_128._M_str);
      in_R8 = LVar25;
      break;
    case 0x14:
      local_118.m_id._M_dataplus._M_p = local_118.m_id._M_dataplus._M_p & 0xffffff0000000000;
      input_06._M_str = local_128._M_str;
      input_06._M_len = (size_t)LVar25;
      bVar28 = Length::parse((Length *)&local_118,input_06,Forbid);
      if (!bVar28) {
        local_118.m_id._M_dataplus._M_p._0_5_ = 0x41400000;
      }
      fVar29 = SUB84(local_118.m_id._M_dataplus._M_p,0);
      if ((LengthUnits)((ulong)local_118.m_id._M_dataplus._M_p >> 0x20) == Ex) {
        fVar29 = fVar29 * this->m_font_size * 0.5;
      }
      else {
        uVar18 = (uint)((ulong)local_118.m_id._M_dataplus._M_p >> 0x20) & 0xff;
        if (uVar18 == 3) {
          fVar29 = fVar29 * this->m_font_size;
        }
        else if (uVar18 == 1) {
          fVar29 = (fVar29 * this->m_font_size) / 100.0;
        }
      }
      this->m_font_size = fVar29;
      break;
    case 0x15:
      lVar27 = 0x10;
      do {
        bVar28 = LVar25 == *(Length *)(&UNK_00159b48 + lVar27);
        if (bVar28) {
          iVar17 = bcmp(__s1,*(void **)(&parseFontStyle(std::basic_string_view<char,std::char_traits<char>>const&)
                                         ::entries + lVar27),(size_t)LVar25);
          bVar28 = iVar17 == 0;
        }
        if (bVar28) {
          FVar14 = (&UNK_00159b40)[lVar27];
          goto LAB_001164f3;
        }
        lVar27 = lVar27 + 0x18;
      } while (lVar27 != 0x58);
      FVar14 = Normal;
LAB_001164f3:
      this->m_font_style = FVar14;
      break;
    case 0x16:
      lVar27 = 0x10;
      do {
        bVar28 = LVar25 == *(Length *)((long)&parseFillRule::entries[1].second._M_str + lVar27);
        if (bVar28) {
          iVar17 = bcmp(__s1,*(void **)(&parseFontWeight(std::basic_string_view<char,std::char_traits<char>>const&)
                                         ::entries + lVar27),(size_t)LVar25);
          bVar28 = iVar17 == 0;
        }
        if (bVar28) {
          FVar10 = *(FontWeight *)((long)&parseFillRule::entries[1].second._M_len + lVar27);
          goto LAB_001164cc;
        }
        lVar27 = lVar27 + 0x18;
      } while (lVar27 != 0x148);
      FVar10 = Normal;
LAB_001164cc:
      this->m_font_weight = FVar10;
      break;
    case 0x22:
      input_02._M_str = in_stack_fffffffffffffec8;
      input_02._M_len = 0x116100;
      parseUrl_abi_cxx11_(input_02);
      this_00 = local_78;
      goto LAB_001162bb;
    case 0x23:
      input_04._M_str = in_stack_fffffffffffffec8;
      input_04._M_len = 0x1162ae;
      parseUrl_abi_cxx11_(input_04);
      this_00 = local_70;
      goto LAB_001162bb;
    case 0x24:
      input_03._M_str = in_stack_fffffffffffffec8;
      input_03._M_len = 0x116217;
      parseUrl_abi_cxx11_(input_03);
      this_00 = local_68;
      goto LAB_001162bb;
    case 0x25:
      input_00._M_str = in_stack_fffffffffffffec8;
      input_00._M_len = 0x115bbb;
      parseUrl_abi_cxx11_(input_00);
      this_00 = local_50;
LAB_001162bb:
      std::__cxx11::string::operator=(this_00,(string *)&local_118);
LAB_001162c3:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118.m_id._M_dataplus._M_p != &local_118.m_id.field_2) {
        uVar26 = local_118.m_id.field_2._M_allocated_capacity + 1;
        LVar25 = (Length)local_118.m_id._M_dataplus._M_p;
LAB_001162dc:
        operator_delete((void *)LVar25,uVar26);
      }
      break;
    case 0x28:
      lVar27 = 0x10;
      do {
        bVar28 = LVar25 == *(Length *)((long)&PTR_anon_var_dwarf_71d37_00159fb8 + lVar27);
        if (bVar28) {
          iVar17 = bcmp(__s1,*(void **)(&parseMaskType(std::basic_string_view<char,std::char_traits<char>>const&)
                                         ::entries + lVar27),(size_t)LVar25);
          bVar28 = iVar17 == 0;
        }
        if (bVar28) {
          MVar7 = *(MaskType *)((long)&DAT_00159fb0 + lVar27);
          goto LAB_00116498;
        }
        lVar27 = lVar27 + 0x18;
      } while (lVar27 != 0x40);
      MVar7 = Luminance;
LAB_00116498:
      this->m_mask_type = MVar7;
      break;
    case 0x2a:
      input_12._M_str = (char *)0x1;
      input_12._M_len = (size_t)local_128._M_str;
      fVar29 = parseNumberOrPercentage((lunasvg *)LVar25,input_12,true,1.0);
      this->m_opacity = fVar29;
      break;
    case 0x2c:
      lVar27 = 0x10;
      do {
        bVar28 = LVar25 == *(Length *)(&UNK_00159f88 + lVar27);
        if (bVar28) {
          iVar17 = bcmp(__s1,*(void **)(&parseOverflow(std::basic_string_view<char,std::char_traits<char>>const&)
                                         ::entries + lVar27),(size_t)LVar25);
          bVar28 = iVar17 == 0;
        }
        if (bVar28) {
          OVar4 = (&UNK_00159f80)[lVar27];
          goto LAB_00116468;
        }
        lVar27 = lVar27 + 0x18;
      } while (lVar27 != 0x40);
      OVar4 = Visible;
LAB_00116468:
      this->m_overflow = OVar4;
      break;
    case 0x39:
      input_07._M_str = (char *)this;
      input_07._M_len = (size_t)local_128._M_str;
      CVar19 = parseColor((lunasvg *)LVar25,input_07,(SVGLayoutState *)&Color::Black,(Color *)in_R8)
      ;
      (this->m_stop_color).m_value = CVar19.m_value;
      break;
    case 0x3a:
      input_05._M_str = (char *)0x1;
      input_05._M_len = (size_t)local_128._M_str;
      fVar29 = parseNumberOrPercentage((lunasvg *)LVar25,input_05,true,1.0);
      this->m_stop_opacity = fVar29;
      break;
    case 0x3b:
      in_R8 = (Length)&Color::Transparent;
      input_16._M_str = (char *)this;
      input_16._M_len = (size_t)local_128._M_str;
      parsePaint(&local_118,(lunasvg *)LVar25,input_16,(SVGLayoutState *)&Color::Transparent,in_R9);
      std::__cxx11::string::operator=(local_48,(string *)&local_118);
      (this->m_stroke).m_color.m_value = local_118.m_color.m_value;
      goto LAB_001162c3;
    case 0x3c:
      local_e8._M_len = (size_t)LVar25;
      local_e8._M_str = local_128._M_str;
      __n.m_value = 5.60519e-45;
      __n.m_units = None;
      __n._5_3_ = 0;
      if ((ulong)LVar25 < 4) {
        __n = LVar25;
      }
      iVar17 = bcmp(local_128._M_str,"none",(size_t)__n);
      if ((LVar25 == (Length)0x4) && (iVar17 == 0)) {
        local_d8.m_value = 0.0;
        local_d8.m_units = None;
        local_d8._5_3_ = 0;
        plStack_d0 = (lunasvg *)0x0;
        local_c8 = 0;
      }
      else {
        local_118.m_id._M_dataplus._M_p = (pointer)0x0;
        local_118.m_id._M_string_length = 0;
        local_118.m_id.field_2._M_allocated_capacity = 0;
        do {
          if ((Length)local_e8._M_len == (Length)0x0) {
            LVar25.m_value = 0.0;
            LVar25.m_units = None;
            LVar25._5_3_ = 0;
          }
          else {
            LVar24.m_value = 0.0;
            LVar24.m_units = None;
            LVar24._5_3_ = 0;
            do {
              uVar26 = (ulong)(byte)*(lunasvg *)
                                     ((long)(_Fwd_list_node_base **)local_e8._M_str + (long)LVar24);
              if ((uVar26 < 0x2d) &&
                 (LVar25 = LVar24, (0x100100002600U >> (uVar26 & 0x3f) & 1) != 0)) break;
              LVar24 = (Length)((long)LVar24 + 1);
              LVar25 = (Length)local_e8._M_len;
            } while ((Length)local_e8._M_len != LVar24);
          }
          local_38.m_value = 0.0;
          local_38.m_units = None;
          LVar23 = (Length)local_e8._M_len;
          if ((ulong)LVar25 <= local_e8._M_len) {
            LVar23 = LVar25;
          }
          input_14._M_str = local_e8._M_str;
          input_14._M_len._0_4_ = LVar23.m_value;
          input_14._M_len._4_1_ = LVar23.m_units;
          input_14._M_len._5_3_ = LVar23._5_3_;
          bVar28 = Length::parse(&local_38,input_14,Forbid);
          if (!bVar28) {
            local_d8.m_value = 0.0;
            local_d8.m_units = None;
            local_d8._5_3_ = 0;
            plStack_d0 = (lunasvg *)0x0;
            local_c8 = 0;
            goto LAB_00116619;
          }
          local_e8._M_str = (char *)((long)(_Fwd_list_node_base **)local_e8._M_str + (long)LVar25);
          local_e8._M_len = local_e8._M_len - (long)LVar25;
          std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>::
          emplace_back<lunasvg::Length>
                    ((vector<lunasvg::Length,_std::allocator<lunasvg::Length>_> *)&local_118,
                     &local_38);
          bVar28 = skipOptionalSpacesOrDelimiter(&local_e8,',');
        } while (bVar28);
        local_d8 = (Length)local_118.m_id._M_dataplus._M_p;
        plStack_d0 = (lunasvg *)local_118.m_id._M_string_length;
        local_c8 = local_118.m_id.field_2._M_allocated_capacity;
        local_118.m_id._M_dataplus._M_p = (pointer)0x0;
        local_118.m_id._M_string_length = 0;
        local_118.m_id.field_2._M_allocated_capacity = 0;
LAB_00116619:
        if ((Length)local_118.m_id._M_dataplus._M_p != (Length)0x0) {
          operator_delete(local_118.m_id._M_dataplus._M_p,
                          local_118.m_id.field_2._M_allocated_capacity -
                          (long)local_118.m_id._M_dataplus._M_p);
        }
      }
      std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>::_M_move_assign
                (local_60,&local_d8);
      if (local_d8 == (Length)0x0) break;
      uVar26 = local_c8 - (long)local_d8;
      LVar25 = local_d8;
      goto LAB_001162dc;
    case 0x3d:
      local_118.m_id._M_dataplus._M_p =
           (pointer)((ulong)local_118.m_id._M_dataplus._M_p._5_3_ << 0x28);
      input_13._M_str = local_128._M_str;
      input_13._M_len = (size_t)LVar25;
      bVar28 = Length::parse((Length *)&local_118,input_13,Allow);
      if (!bVar28) {
        local_118.m_id._M_dataplus._M_p = local_118.m_id._M_dataplus._M_p & 0xffffff0000000000;
      }
      (this->m_stroke_dashoffset).m_value = SUB84(local_118.m_id._M_dataplus._M_p,0);
      (this->m_stroke_dashoffset).m_units =
           (LengthUnits)((ulong)local_118.m_id._M_dataplus._M_p >> 0x20);
      break;
    case 0x3e:
      lVar27 = 0x10;
      do {
        bVar28 = LVar25 == *(Length *)((long)&PTR_what_00159938 + lVar27);
        if (bVar28) {
          iVar17 = bcmp(__s1,*(void **)(&parseLineCap(std::basic_string_view<char,std::char_traits<char>>const&)
                                         ::entries + lVar27),(size_t)LVar25);
          bVar28 = iVar17 == 0;
        }
        if (bVar28) {
          LVar15 = *(LineCap *)((long)&PTR__bad_optional_access_00159930 + lVar27);
          goto LAB_00116500;
        }
        lVar27 = lVar27 + 0x18;
      } while (lVar27 != 0x58);
      LVar15 = Butt;
LAB_00116500:
      this->m_stroke_linecap = LVar15;
      break;
    case 0x3f:
      lVar27 = 0x10;
      do {
        bVar28 = LVar25 == *(Length *)(&UNK_00159988 + lVar27);
        if (bVar28) {
          iVar17 = bcmp(__s1,*(void **)(&parseLineJoin(std::basic_string_view<char,std::char_traits<char>>const&)
                                         ::entries + lVar27),(size_t)LVar25);
          bVar28 = iVar17 == 0;
        }
        if (bVar28) {
          LVar6 = (&UNK_00159980)[lVar27];
          goto LAB_00116488;
        }
        lVar27 = lVar27 + 0x18;
      } while (lVar27 != 0x58);
      LVar6 = Miter;
LAB_00116488:
      this->m_stroke_linejoin = LVar6;
      break;
    case 0x40:
      local_118.m_id._M_dataplus._M_p = (pointer)LVar25;
      local_118.m_id._M_string_length = (size_type)local_128._M_str;
      bVar28 = parseNumber<float>((string_view *)&local_118,&local_d8.m_value);
      fVar29 = 4.0;
      if ((Length)local_118.m_id._M_dataplus._M_p == (Length)0x0) {
        fVar29 = local_d8.m_value;
      }
      if (!bVar28) {
        fVar29 = 4.0;
      }
      this->m_stroke_miterlimit = fVar29;
      break;
    case 0x41:
      input_11._M_str = (char *)0x1;
      input_11._M_len = (size_t)local_128._M_str;
      fVar29 = parseNumberOrPercentage((lunasvg *)LVar25,input_11,true,1.0);
      this->m_stroke_opacity = fVar29;
      break;
    case 0x42:
      local_118.m_id._M_dataplus._M_p =
           (pointer)((ulong)local_118.m_id._M_dataplus._M_p._5_3_ << 0x28);
      input_08._M_str = local_128._M_str;
      input_08._M_len = (size_t)LVar25;
      bVar28 = Length::parse((Length *)&local_118,input_08,Forbid);
      if (!bVar28) {
        local_118.m_id._M_dataplus._M_p._0_5_ = 0x3f800000;
      }
      (this->m_stroke_width).m_value = SUB84(local_118.m_id._M_dataplus._M_p,0);
      (this->m_stroke_width).m_units = (LengthUnits)((ulong)local_118.m_id._M_dataplus._M_p >> 0x20)
      ;
      break;
    case 0x45:
      lVar27 = 0x10;
      do {
        bVar28 = LVar25 == *(Length *)((long)&PTR_anon_var_dwarf_71bac_00159e08 + lVar27);
        if (bVar28) {
          iVar17 = bcmp(__s1,*(void **)(&parseTextAnchor(std::basic_string_view<char,std::char_traits<char>>const&)
                                         ::entries + lVar27),(size_t)LVar25);
          bVar28 = iVar17 == 0;
        }
        if (bVar28) {
          TVar16 = *(TextAnchor *)((long)&DAT_00159e00 + lVar27);
          goto LAB_0011650d;
        }
        lVar27 = lVar27 + 0x18;
      } while (lVar27 != 0x58);
      TVar16 = Start;
LAB_0011650d:
      this->m_text_anchor = TVar16;
      break;
    case 0x48:
      lVar27 = 0x10;
      do {
        bVar28 = LVar25 == *(Length *)((long)&PTR_anon_var_dwarf_6984c_00159f38 + lVar27);
        if (bVar28) {
          iVar17 = bcmp(__s1,*(void **)(&parseVisibility(std::basic_string_view<char,std::char_traits<char>>const&)
                                         ::entries + lVar27),(size_t)LVar25);
          bVar28 = iVar17 == 0;
        }
        if (bVar28) {
          VVar5 = *(Visibility *)((long)&DAT_00159f30 + lVar27);
          goto LAB_00116478;
        }
        lVar27 = lVar27 + 0x18;
      } while (lVar27 != 0x58);
      VVar5 = Visible;
LAB_00116478:
      this->m_visibility = VVar5;
      break;
    case 0x49:
      lVar27 = 0x10;
      do {
        bVar28 = LVar25 == *(Length *)(&UNK_00159e58 + lVar27);
        if (bVar28) {
          iVar17 = bcmp(__s1,*(void **)(&parseWhiteSpace(std::basic_string_view<char,std::char_traits<char>>const&)
                                         ::entries + lVar27),(size_t)LVar25);
          bVar28 = iVar17 == 0;
        }
        if (bVar28) {
          WVar12 = (&UNK_00159e50)[lVar27];
          goto LAB_001164e6;
        }
        lVar27 = lVar27 + 0x18;
      } while (lVar27 != 0xb8);
      WVar12 = Default;
LAB_001164e6:
      this->m_white_space = WVar12;
    }
switchD_00115b4a_caseD_3:
    p_Var2 = p_Var2->_M_next;
  } while( true );
}

Assistant:

SVGLayoutState::SVGLayoutState(const SVGLayoutState& parent, const SVGElement* element)
    : m_parent(&parent)
    , m_element(element)
    , m_fill(parent.fill())
    , m_stroke(parent.stroke())
    , m_color(parent.color())
    , m_fill_opacity(parent.fill_opacity())
    , m_stroke_opacity(parent.stroke_opacity())
    , m_stroke_miterlimit(parent.stroke_miterlimit())
    , m_font_size(parent.font_size())
    , m_stroke_width(parent.stroke_width())
    , m_stroke_dashoffset(parent.stroke_dashoffset())
    , m_stroke_dasharray(parent.stroke_dasharray())
    , m_stroke_linecap(parent.stroke_linecap())
    , m_stroke_linejoin(parent.stroke_linejoin())
    , m_fill_rule(parent.fill_rule())
    , m_clip_rule(parent.clip_rule())
    , m_font_weight(parent.font_weight())
    , m_font_style(parent.font_style())
    , m_dominant_baseline(parent.dominant_baseline())
    , m_text_anchor(parent.text_anchor())
    , m_white_space(parent.white_space())
    , m_direction(parent.direction())
    , m_visibility(parent.visibility())
    , m_overflow(element->isRootElement() ? Overflow::Visible : Overflow::Hidden)
    , m_marker_start(parent.marker_start())
    , m_marker_mid(parent.marker_mid())
    , m_marker_end(parent.marker_end())
    , m_font_family(parent.font_family())
{
    for(const auto& attribute : element->attributes()) {
        std::string_view input(attribute.value());
        stripLeadingAndTrailingSpaces(input);
        if(input.empty() || input.compare("inherit") == 0)
            continue;
        switch(attribute.id()) {
        case PropertyID::Fill:
            m_fill = parsePaint(input, this, Color::Black);
            break;
        case PropertyID::Stroke:
            m_stroke = parsePaint(input, this, Color::Transparent);
            break;
        case PropertyID::Color:
            m_color = parseColor(input, this, Color::Black);
            break;
        case PropertyID::Stop_Color:
            m_stop_color = parseColor(input, this, Color::Black);
            break;
        case PropertyID::Opacity:
            m_opacity = parseNumberOrPercentage(input, true, 1.f);
            break;
        case PropertyID::Fill_Opacity:
            m_fill_opacity = parseNumberOrPercentage(input, true, 1.f);
            break;
        case PropertyID::Stroke_Opacity:
            m_stroke_opacity = parseNumberOrPercentage(input, true, 1.f);
            break;
        case PropertyID::Stop_Opacity:
            m_stop_opacity = parseNumberOrPercentage(input, true, 1.f);
            break;
        case PropertyID::Stroke_Miterlimit:
            m_stroke_miterlimit = parseNumberOrPercentage(input, false, 4.f);
            break;
        case PropertyID::Font_Size:
            m_font_size = parseFontSize(input, this);
            break;
        case PropertyID::Baseline_Shift:
            m_baseline_shit = parseBaselineShift(input);
            break;
        case PropertyID::Stroke_Width:
            m_stroke_width = parseLength(input, LengthNegativeMode::Forbid, Length(1.f, LengthUnits::None));
            break;
        case PropertyID::Stroke_Dashoffset:
            m_stroke_dashoffset = parseLength(input, LengthNegativeMode::Allow, Length(0.f, LengthUnits::None));
            break;
        case PropertyID::Stroke_Dasharray:
            m_stroke_dasharray = parseDashArray(input);
            break;
        case PropertyID::Stroke_Linecap:
            m_stroke_linecap = parseLineCap(input);
            break;
        case PropertyID::Stroke_Linejoin:
            m_stroke_linejoin = parseLineJoin(input);
            break;
        case PropertyID::Fill_Rule:
            m_fill_rule = parseFillRule(input);
            break;
        case PropertyID::Clip_Rule:
            m_clip_rule = parseFillRule(input);
            break;
        case PropertyID::Font_Weight:
            m_font_weight = parseFontWeight(input);
            break;
        case PropertyID::Font_Style:
            m_font_style = parseFontStyle(input);
            break;
        case PropertyID::Alignment_Baseline:
            m_alignment_baseline = parseAlignmentBaseline(input);
            break;
        case PropertyID::Dominant_Baseline:
            m_dominant_baseline = parseDominantBaseline(input);
            break;
        case PropertyID::Direction:
            m_direction = parseDirection(input);
            break;
        case PropertyID::Text_Anchor:
            m_text_anchor = parseTextAnchor(input);
            break;
        case PropertyID::WhiteSpace:
            m_white_space = parseWhiteSpace(input);
            break;
        case PropertyID::Display:
            m_display = parseDisplay(input);
            break;
        case PropertyID::Visibility:
            m_visibility = parseVisibility(input);
            break;
        case PropertyID::Overflow:
            m_overflow = parseOverflow(input);
            break;
        case PropertyID::Mask_Type:
            m_mask_type = parseMaskType(input);
            break;
        case PropertyID::Mask:
            m_mask = parseUrl(input);
            break;
        case PropertyID::Clip_Path:
            m_clip_path = parseUrl(input);
            break;
        case PropertyID::Marker_Start:
            m_marker_start = parseUrl(input);
            break;
        case PropertyID::Marker_Mid:
            m_marker_mid = parseUrl(input);
            break;
        case PropertyID::Marker_End:
            m_marker_end = parseUrl(input);
            break;
        case PropertyID::Font_Family:
            m_font_family.assign(input);
            break;
        default:
            break;
        }
    }
}